

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

string * __thiscall
soul::ExpressionHelpers::resolvePartialNameAsUID_abi_cxx11_
          (string *__return_storage_ptr__,ExpressionHelpers *this,ModuleBase *module,
          IdentifierPath *partialName)

{
  ASTObject *pAVar1;
  pool_ref<soul::AST::ASTObject> *ppVar2;
  ModuleBase *this_00;
  TypeDeclarationBase *this_01;
  VariableDeclaration *this_02;
  EndpointDeclaration *this_03;
  Function *this_04;
  ModuleBase *m;
  TypeDeclarationBase *t;
  VariableDeclaration *v;
  EndpointDeclaration *e;
  Function *f;
  pool_ptr<soul::AST::ModuleBase> mb;
  pool_ref<soul::AST::ASTObject> local_100;
  pool_ref<soul::AST::ASTObject> local_f8;
  pool_ref<soul::AST::ASTObject> local_f0;
  pool_ref<soul::AST::ASTObject> local_e8;
  pool_ref<soul::AST::ASTObject> local_e0;
  NameSearch local_d8;
  
  local_d8.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)local_d8.itemsFound.space;
  local_d8.itemsFound.numActive = 0;
  local_d8.itemsFound.numAllocated = 8;
  local_d8.partiallyQualifiedPath.pathSections.items =
       (Identifier *)local_d8.partiallyQualifiedPath.pathSections.space;
  local_d8.partiallyQualifiedPath.pathSections.numActive = 0;
  local_d8.partiallyQualifiedPath.pathSections.numAllocated = 8;
  local_d8.stopAtFirstScopeWithResults = false;
  local_d8.requiredNumFunctionArgs = -1;
  local_d8.findVariables = true;
  local_d8.findTypes = true;
  local_d8.findFunctions = true;
  local_d8.findNamespaces = true;
  local_d8.findProcessors = true;
  local_d8.findProcessorInstances = false;
  local_d8.findEndpoints = true;
  local_d8.onlyFindLocalVariables = false;
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
            (&local_d8.partiallyQualifiedPath.pathSections,
             (ArrayWithPreallocation<soul::Identifier,_8UL> *)module);
  local_d8.stopAtFirstScopeWithResults = true;
  local_d8.findProcessors = true;
  local_d8._184_4_ = 0x1010101;
  local_d8.findProcessorInstances = false;
  local_d8.findEndpoints = true;
  AST::Scope::performFullNameSearch((Scope *)(this + 0x28),&local_d8,(Statement *)0x0);
  if (local_d8.itemsFound.numActive != 0) {
    ppVar2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                       (&local_d8.itemsFound);
    pAVar1 = ppVar2->object;
    local_e0.object = pAVar1;
    cast<soul::AST::ModuleBase,soul::AST::ASTObject>((soul *)&mb,&local_e0);
    if (mb.object != (ModuleBase *)0x0) {
      this_00 = pool_ptr<soul::AST::ModuleBase>::operator*(&mb);
      makeUID_abi_cxx11_(__return_storage_ptr__,(soul *)this_00,m);
      goto LAB_00260cc0;
    }
    local_e8.object = pAVar1;
    cast<soul::AST::TypeDeclarationBase,soul::AST::ASTObject>((soul *)&mb,&local_e8);
    if (mb.object != (ModuleBase *)0x0) {
      this_01 = pool_ptr<soul::AST::TypeDeclarationBase>::operator*
                          ((pool_ptr<soul::AST::TypeDeclarationBase> *)&mb);
      makeUID_abi_cxx11_(__return_storage_ptr__,(soul *)this_01,t);
      goto LAB_00260cc0;
    }
    local_f0.object = pAVar1;
    cast<soul::AST::VariableDeclaration,soul::AST::ASTObject>((soul *)&mb,&local_f0);
    if (mb.object != (ModuleBase *)0x0) {
      this_02 = pool_ptr<soul::AST::VariableDeclaration>::operator*
                          ((pool_ptr<soul::AST::VariableDeclaration> *)&mb);
      makeUID_abi_cxx11_(__return_storage_ptr__,(soul *)this_02,v);
      goto LAB_00260cc0;
    }
    local_f8.object = pAVar1;
    cast<soul::AST::EndpointDeclaration,soul::AST::ASTObject>((soul *)&mb,&local_f8);
    if (mb.object != (ModuleBase *)0x0) {
      this_03 = pool_ptr<soul::AST::EndpointDeclaration>::operator*
                          ((pool_ptr<soul::AST::EndpointDeclaration> *)&mb);
      makeUID_abi_cxx11_(__return_storage_ptr__,(soul *)this_03,e);
      goto LAB_00260cc0;
    }
    local_100.object = pAVar1;
    cast<soul::AST::Function,soul::AST::ASTObject>((soul *)&mb,&local_100);
    if (mb.object != (ModuleBase *)0x0) {
      this_04 = pool_ptr<soul::AST::Function>::operator*((pool_ptr<soul::AST::Function> *)&mb);
      makeUID_abi_cxx11_(__return_storage_ptr__,(soul *)this_04,f);
      goto LAB_00260cc0;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00260cc0:
  AST::Scope::NameSearch::~NameSearch(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

static std::string resolvePartialNameAsUID (AST::ModuleBase& module, const IdentifierPath& partialName)
    {
        AST::Scope::NameSearch search;
        search.partiallyQualifiedPath = partialName;
        search.stopAtFirstScopeWithResults = true;
        search.findVariables = true;
        search.findTypes = true;
        search.findFunctions = true;
        search.findNamespaces = true;
        search.findProcessors = true;
        search.findProcessorInstances = false;
        search.findEndpoints = true;

        module.performFullNameSearch (search, nullptr);

        if (search.itemsFound.size() != 0)
        {
            auto item = search.itemsFound.front();

            if (auto mb = cast<AST::ModuleBase> (item))            return makeUID (*mb);
            if (auto t = cast<AST::TypeDeclarationBase> (item))    return makeUID (*t);
            if (auto v = cast<AST::VariableDeclaration> (item))    return makeUID (*v);
            if (auto e = cast<AST::EndpointDeclaration> (item))    return makeUID (*e);
            if (auto f = cast<AST::Function> (item))               return makeUID (*f);
        }

        return {};
    }